

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadowLod(ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float *pfVar1;
  float fVar2;
  TexLookupParams *param_1_local;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y(c->in);
  t = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in + 1);
  fVar2 = texture2DShadow(c,fVar2,s,t,*pfVar1);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadowLod			(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), c.in[1].x()); }